

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  uint *puVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  mbedtls_ssl_handshake_params *pmVar6;
  mbedtls_ssl_flight_item *pmVar7;
  mbedtls_cipher_info_t *pmVar8;
  byte *pbVar9;
  mbedtls_ssl_transform *pmVar10;
  size_t ilen;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  mbedtls_ssl_flight_item *__ptr;
  uchar *puVar16;
  mbedtls_ssl_flight_item *pmVar17;
  size_t sVar18;
  long lVar19;
  uchar uVar20;
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  size_t sVar26;
  size_t sVar27;
  size_t olen;
  size_t olen_1;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar29;
  size_t *psVar28;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar31;
  uchar *input;
  long lVar30;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar32;
  size_t local_48;
  undefined2 local_40;
  uchar local_3e;
  ushort local_3d;
  size_t local_38;
  
  uVar32 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar27 = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xa8d,"=> write record");
  if (((((ssl->conf->field_0x174 & 2) == 0) ||
       (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) ||
      (ssl->handshake->retransmit_state != '\x01')) && (ssl->out_msgtype == 0x16)) {
    uVar20 = *ssl->out_msg;
    if ((uVar20 != '\0') && (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xa9f,"should never happen");
      return -0x6c00;
    }
    sVar1 = sVar27 - 4;
    ssl->out_msg[1] = (uchar)(sVar1 >> 0x10);
    ssl->out_msg[2] = (uchar)(sVar1 >> 8);
    ssl->out_msg[3] = (uchar)sVar1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,sVar1);
      ssl->out_msglen = ssl->out_msglen + 8;
      if (uVar20 == '\0') {
        ssl->out_msg[4] = '\0';
        ssl->out_msg[5] = '\0';
      }
      else {
        ssl->out_msg[4] = *(uchar *)((long)&ssl->handshake->out_msg_seq + 1);
        ssl->out_msg[5] = (uchar)ssl->handshake->out_msg_seq;
        puVar2 = &ssl->handshake->out_msg_seq;
        *puVar2 = *puVar2 + 1;
      }
      sVar27 = sVar27 + 8;
      puVar16 = ssl->out_msg;
      puVar16[8] = '\0';
      puVar16[6] = '\0';
      puVar16[7] = '\0';
      puVar16 = ssl->out_msg;
      puVar16[0xb] = puVar16[3];
      *(undefined2 *)(puVar16 + 9) = *(undefined2 *)(puVar16 + 1);
    }
    if (uVar20 != '\0') {
      (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,sVar27);
    }
  }
  if ((((ssl->conf->field_0x174 & 2) == 0) ||
      (pmVar6 = ssl->handshake, pmVar6 == (mbedtls_ssl_handshake_params *)0x0)) ||
     ((pmVar6->retransmit_state == '\x01' || (uVar5 = ssl->out_msgtype, (uVar5 | 2) != 0x16)))) {
LAB_00113ab0:
    *ssl->out_hdr = (uchar)ssl->out_msgtype;
    iVar13 = ssl->minor_ver;
    puVar16 = ssl->out_hdr;
    uVar20 = (uchar)ssl->major_ver;
    if ((ssl->conf->field_0x174 & 2) == 0) {
      puVar16[1] = uVar20;
      uVar20 = (uchar)iVar13;
    }
    else {
      puVar16[1] = '\x01' - uVar20;
      iVar12 = 1;
      if (iVar13 != 2) {
        iVar12 = iVar13;
      }
      uVar20 = -(char)iVar12;
    }
    puVar16[2] = uVar20;
    *ssl->out_len = (uchar)(sVar27 >> 8);
    ssl->out_len[1] = (uchar)sVar27;
    if (ssl->transform_out != (mbedtls_ssl_transform *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x4ea,"=> encrypt buf");
      if ((ssl->session_out == (mbedtls_ssl_session *)0x0) ||
         (ssl->transform_out == (mbedtls_ssl_transform *)0x0)) {
        iVar13 = 0x4ee;
LAB_00113b7f:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,iVar13,"should never happen");
        iVar13 = -0x6c00;
      }
      else {
        pmVar8 = (ssl->transform_out->cipher_ctx_enc).cipher_info;
        if (pmVar8 == (mbedtls_cipher_info_t *)0x0) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)pmVar8->mode;
        }
        sVar27 = ssl->out_msglen;
        mbedtls_debug_print_buf
                  (ssl,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x4f5,"before encrypt: output payload",ssl->out_msg,sVar27);
        uVar29 = (undefined4)(sVar27 >> 0x20);
        iVar12 = (int)uVar23;
        if (iVar12 == 7) {
LAB_00113d32:
          if (ssl->minor_ver < 1) {
            iVar13 = 0x51c;
            goto LAB_00113b7f;
          }
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_ctr,8);
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_hdr,3);
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_len,2);
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_msg,ssl->out_msglen);
          mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,ssl->out_msg + ssl->out_msglen);
          mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
          sVar27 = ssl->transform_out->maclen;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x522,"computed mac",ssl->out_msg + ssl->out_msglen,sVar27);
          ssl->out_msglen = ssl->out_msglen + ssl->transform_out->maclen;
          bVar11 = false;
          iVar15 = 1;
        }
        else {
          bVar11 = true;
          iVar15 = 0;
          if ((iVar12 == 2) && (iVar15 = 0, ssl->session_out->encrypt_then_mac == 0))
          goto LAB_00113d32;
        }
        uVar29 = (undefined4)(sVar27 >> 0x20);
        if (iVar12 == 7) {
          psVar28 = &local_48;
          local_48 = 0;
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x534,"before encrypt: msglen = %d, including %d bytes of padding",
                     ssl->out_msglen,sVar27 & 0xffffffff00000000);
          pmVar10 = ssl->transform_out;
          iVar13 = mbedtls_cipher_crypt
                             (&pmVar10->cipher_ctx_enc,pmVar10->iv_enc,pmVar10->ivlen,ssl->out_msg,
                              ssl->out_msglen,ssl->out_msg,psVar28);
          uVar29 = (undefined4)((ulong)psVar28 >> 0x20);
          if (iVar13 == 0) {
            iVar13 = iVar12;
            if (ssl->out_msglen == local_48) {
LAB_00113f8b:
              bVar11 = true;
            }
            else {
              iVar13 = 0x542;
LAB_0011421d:
              bVar11 = false;
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,iVar13,"should never happen");
              iVar13 = -0x6c00;
            }
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x53c,"mbedtls_cipher_crypt",iVar13);
LAB_00113ed9:
            bVar11 = false;
          }
        }
        else {
          if (iVar12 == 2) {
            local_38 = 0;
            uVar23 = ssl->transform_out->ivlen;
            lVar24 = 0;
            uVar22 = (ssl->out_msglen + 1) % uVar23;
            lVar19 = uVar23 - uVar22;
            if (uVar22 == 0) {
              lVar19 = 0;
            }
            lVar30 = lVar19 + 1;
            do {
              ssl->out_msg[lVar24 + ssl->out_msglen] = (uchar)lVar19;
              lVar24 = lVar24 + 1;
            } while (lVar19 + 1 + (ulong)(lVar30 == 0) != lVar24);
            sVar27 = ssl->out_msglen + lVar30;
            ssl->out_msglen = sVar27;
            if (ssl->minor_ver < 2) {
              puVar16 = ssl->out_msg;
            }
            else {
              iVar13 = (*ssl->conf->f_rng)(ssl->conf->p_rng,ssl->transform_out->iv_enc,
                                           ssl->transform_out->ivlen);
              if (iVar13 != 0) goto LAB_00113ed9;
              memcpy(ssl->out_iv,ssl->transform_out->iv_enc,ssl->transform_out->ivlen);
              puVar16 = ssl->out_msg;
              sVar27 = ssl->out_msglen;
              ssl->out_msglen = ssl->transform_out->ivlen + sVar27;
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x5c9,
                       "before encrypt: msglen = %d, including %d bytes of IV and %d bytes of padding"
                       ,ssl->out_msglen,ssl->transform_out->ivlen,lVar30);
            uVar31 = (undefined4)((ulong)lVar30 >> 0x20);
            pmVar10 = ssl->transform_out;
            psVar28 = &local_38;
            iVar14 = mbedtls_cipher_crypt
                               (&pmVar10->cipher_ctx_enc,pmVar10->iv_enc,pmVar10->ivlen,puVar16,
                                sVar27,puVar16,psVar28);
            uVar29 = (undefined4)((ulong)psVar28 >> 0x20);
            if (iVar14 == 0) {
              if (sVar27 != local_38) {
                iVar13 = 0x5d7;
                goto LAB_0011421d;
              }
              if (ssl->minor_ver < 2) {
                pmVar10 = ssl->transform_out;
                memcpy(pmVar10->iv_enc,(pmVar10->cipher_ctx_enc).iv,pmVar10->ivlen);
              }
              iVar15 = 1;
              iVar13 = iVar12;
              if (bVar11) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x5f4,"using encrypt then mac");
                local_48 = *(size_t *)ssl->out_ctr;
                local_3e = ssl->out_hdr[2];
                local_40 = *(undefined2 *)ssl->out_hdr;
                uVar4 = (ushort)ssl->out_msglen;
                local_3d = uVar4 << 8 | uVar4 >> 8;
                uVar29 = 0;
                mbedtls_debug_print_buf
                          (ssl,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x5fb,"MAC\'d meta-data",(uchar *)&local_48,0xd);
                iVar15 = 1;
                mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,(uchar *)&local_48,0xd);
                mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_iv,ssl->out_msglen);
                mbedtls_md_hmac_finish
                          (&ssl->transform_out->md_ctx_enc,ssl->out_iv + ssl->out_msglen);
                mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
                ssl->out_msglen = ssl->out_msglen + ssl->transform_out->maclen;
              }
              goto LAB_00113f8b;
            }
            pcVar25 = "mbedtls_cipher_crypt";
            iVar13 = 0x5d1;
LAB_00114373:
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,iVar13,pcVar25,iVar14);
            iVar13 = iVar14;
          }
          else {
            if ((iVar12 != 8) && (iVar12 != 6)) {
              iVar13 = 0x60d;
              goto LAB_00113b7f;
            }
            bVar3 = ssl->transform_out->ciphersuite_info->flags;
            iVar13 = (int)CONCAT71((int7)(uVar23 >> 8),bVar3);
            local_48 = *(size_t *)ssl->out_ctr;
            iVar12 = ssl->minor_ver;
            cVar21 = (char)ssl->major_ver;
            if ((ssl->conf->field_0x174 & 2) == 0) {
              local_3e = (uchar)iVar12;
            }
            else {
              cVar21 = '\x01' - cVar21;
              iVar14 = 1;
              if (iVar12 != 2) {
                iVar14 = iVar12;
              }
              local_3e = -(char)iVar14;
            }
            local_40 = CONCAT11(cVar21,(char)ssl->out_msgtype);
            uVar4 = (ushort)ssl->out_msglen;
            local_3d = uVar4 << 8 | uVar4 >> 8;
            uVar29 = 0;
            mbedtls_debug_print_buf
                      (ssl,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x55b,"additional data used for AEAD",(uchar *)&local_48,0xd);
            pmVar10 = ssl->transform_out;
            if (pmVar10->ivlen - pmVar10->fixed_ivlen != 8) {
              iVar13 = 0x563;
              goto LAB_0011421d;
            }
            sVar27 = (ulong)((bVar3 & 2) == 0) * 8 + 8;
            *(undefined8 *)(pmVar10->iv_enc + pmVar10->fixed_ivlen) = *(undefined8 *)ssl->out_ctr;
            *(undefined8 *)ssl->out_iv = *(undefined8 *)ssl->out_ctr;
            sVar18 = ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen;
            mbedtls_debug_print_buf
                      (ssl,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x56c,"IV used",ssl->out_iv,sVar18);
            input = ssl->out_msg;
            ilen = ssl->out_msglen;
            sVar26 = (ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen) + ilen;
            ssl->out_msglen = sVar26;
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x578,"before encrypt: msglen = %d, including %d bytes of padding",sVar26,
                       sVar18 & 0xffffffff00000000);
            pmVar10 = ssl->transform_out;
            puVar16 = input + ilen;
            psVar28 = &local_38;
            sVar18 = ilen;
            iVar14 = mbedtls_cipher_auth_encrypt
                               (&pmVar10->cipher_ctx_enc,pmVar10->iv_enc,pmVar10->ivlen,
                                (uchar *)&local_48,0xd,input,ilen,input,psVar28,puVar16,sVar27);
            uVar29 = (undefined4)(sVar18 >> 0x20);
            uVar31 = (undefined4)((ulong)input >> 0x20);
            uVar32 = (undefined4)((ulong)psVar28 >> 0x20);
            if (iVar14 != 0) {
              pcVar25 = "mbedtls_cipher_auth_encrypt";
              iVar13 = 0x585;
              goto LAB_00114373;
            }
            if (local_38 == ilen) {
              ssl->out_msglen = ssl->out_msglen + sVar27;
              iVar15 = iVar15 + 1;
              mbedtls_debug_print_buf
                        (ssl,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x592,"after encrypt: tag",puVar16,sVar27);
              uVar29 = (undefined4)(sVar27 >> 0x20);
              goto LAB_00113f8b;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x58b,"should never happen");
            iVar13 = -0x6c00;
          }
          bVar11 = false;
        }
        if (bVar11) {
          if (iVar15 != 1) {
            iVar13 = 0x614;
            goto LAB_00113b7f;
          }
          iVar13 = 0;
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x618,"<= encrypt buf");
        }
      }
      if (iVar13 != 0) {
        pcVar25 = "ssl_encrypt_buf";
        iVar12 = 0xb08;
        goto LAB_00113baa;
      }
      sVar27 = ssl->out_msglen;
      *ssl->out_len = (uchar)(sVar27 >> 8);
      ssl->out_len[1] = (uchar)sVar27;
    }
    pbVar9 = ssl->out_hdr;
    ssl->out_left = ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5;
    iVar13 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xb16,"output record: msgtype = %d, version = [%d:%d], msglen = %d",(ulong)*pbVar9,
               CONCAT44(uVar29,(uint)pbVar9[1]),CONCAT44(uVar31,(uint)pbVar9[2]),
               CONCAT44(uVar32,(uint)(ushort)(*(ushort *)ssl->out_len << 8 |
                                             *(ushort *)ssl->out_len >> 8)));
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xb19,"output record sent to network",ssl->out_hdr,
               ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
    iVar12 = mbedtls_ssl_flush_output(ssl);
    if (iVar12 == 0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb22,"<= write record");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb1e,"mbedtls_ssl_flush_output",iVar12);
      iVar13 = iVar12;
    }
  }
  else {
    __ptr = (mbedtls_ssl_flight_item *)calloc(1,0x20);
    if (__ptr == (mbedtls_ssl_flight_item *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x9b0,"alloc %d bytes failed",0x20);
LAB_00113a93:
      bVar11 = false;
      iVar13 = -0x7f00;
    }
    else {
      sVar1 = ssl->out_msglen;
      puVar16 = (uchar *)calloc(1,sVar1);
      __ptr->p = puVar16;
      if (puVar16 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x9b6,"alloc %d bytes failed",sVar1);
        free(__ptr);
        goto LAB_00113a93;
      }
      memcpy(puVar16,ssl->out_msg,sVar1);
      __ptr->len = sVar1;
      __ptr->type = (uchar)uVar5;
      __ptr->next = (mbedtls_ssl_flight_item *)0x0;
      pmVar7 = pmVar6->flight;
      if (pmVar6->flight == (mbedtls_ssl_flight_item *)0x0) {
        pmVar6->flight = __ptr;
      }
      else {
        do {
          pmVar17 = pmVar7;
          pmVar7 = pmVar17->next;
        } while (pmVar7 != (mbedtls_ssl_flight_item *)0x0);
        pmVar17->next = __ptr;
      }
      iVar13 = 0;
      bVar11 = true;
    }
    if (bVar11) goto LAB_00113ab0;
    pcVar25 = "ssl_flight_append";
    iVar12 = 0xad7;
LAB_00113baa:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar12,pcVar25,iVar13);
  }
  return iVar13;
}

Assistant:

int mbedtls_ssl_write_record( mbedtls_ssl_context *ssl )
{
    int ret, done = 0, out_msg_type;
    size_t len = ssl->out_msglen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write record" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        ; /* Skip special handshake treatment when resending */
    }
    else
#endif
    if( ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        out_msg_type = ssl->out_msg[0];

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST &&
            ssl->handshake == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msg[1] = (unsigned char)( ( len - 4 ) >> 16 );
        ssl->out_msg[2] = (unsigned char)( ( len - 4 ) >>  8 );
        ssl->out_msg[3] = (unsigned char)( ( len - 4 )       );

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Make room for the additional DTLS fields */
            memmove( ssl->out_msg + 12, ssl->out_msg + 4, len - 4 );
            ssl->out_msglen += 8;
            len += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            {
                ssl->out_msg[4] = ( ssl->handshake->out_msg_seq >> 8 ) & 0xFF;
                ssl->out_msg[5] = ( ssl->handshake->out_msg_seq      ) & 0xFF;
                ++( ssl->handshake->out_msg_seq );
            }
            else
            {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* We don't fragment, so frag_offset = 0 and frag_len = len */
            memset( ssl->out_msg + 6, 0x00, 3 );
            memcpy( ssl->out_msg + 9, ssl->out_msg + 1, 3 );
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            ssl->handshake->update_checksum( ssl, ssl->out_msg, len );
    }

    /* Save handshake and CCS messages for resending */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING &&
        ( ssl->out_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC ||
          ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE ) )
    {
        if( ( ret = ssl_flight_append( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_flight_append", ret );
            return( ret );
        }
    }
#endif

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->transform_out != NULL &&
        ssl->session_out->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ( ret = ssl_compress_buf( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_compress_buf", ret );
            return( ret );
        }

        len = ssl->out_msglen;
    }
#endif /*MBEDTLS_ZLIB_SUPPORT */

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_write != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_write()" ) );

        ret = mbedtls_ssl_hw_record_write( ssl );
        if( ret != 0 && ret != MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_write", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }

        if( ret == 0 )
            done = 1;
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */
    if( !done )
    {
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, ssl->out_hdr + 1 );

        ssl->out_len[0] = (unsigned char)( len >> 8 );
        ssl->out_len[1] = (unsigned char)( len      );

        if( ssl->transform_out != NULL )
        {
            if( ( ret = ssl_encrypt_buf( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_encrypt_buf", ret );
                return( ret );
            }

            len = ssl->out_msglen;
            ssl->out_len[0] = (unsigned char)( len >> 8 );
            ssl->out_len[1] = (unsigned char)( len      );
        }

        ssl->out_left = mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "output record: msgtype = %d, "
                            "version = [%d:%d], msglen = %d",
                       ssl->out_hdr[0], ssl->out_hdr[1], ssl->out_hdr[2],
                     ( ssl->out_len[0] << 8 ) | ssl->out_len[1] ) );

        MBEDTLS_SSL_DEBUG_BUF( 4, "output record sent to network",
                       ssl->out_hdr, mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen );
    }

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write record" ) );

    return( 0 );
}